

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O3

void __thiscall QVariantAnimationPrivate::convertValues(QVariantAnimationPrivate *this,int t)

{
  pointer ppVar1;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  QMetaType type;
  QMetaType local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  QMetaType::QMetaType(&local_30,t);
  if ((this->keyValues).d.size != 0) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      ppVar1 = QList<std::pair<double,_QVariant>_>::data(&this->keyValues);
      ::QVariant::convert((QVariant *)((long)&ppVar1->first + lVar3),local_30);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar2 < (ulong)(this->keyValues).d.size);
  }
  ::QVariant::convert(&(this->currentInterval).start.second,local_30);
  ::QVariant::convert(&(this->currentInterval).end.second,local_30);
  updateInterpolator(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimationPrivate::convertValues(int t)
{
    auto type = QMetaType(t);
    //this ensures that all the keyValues are of type t
    for (int i = 0; i < keyValues.size(); ++i) {
        QVariantAnimation::KeyValue &pair = keyValues[i];
        pair.second.convert(type);
    }
    //we also need update to the current interval if needed
    currentInterval.start.second.convert(type);
    currentInterval.end.second.convert(type);

    //... and the interpolator
    updateInterpolator();
}